

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O0

void __thiscall UnifiedRegex::CharSetLeaf::CharSetLeaf(CharSetLeaf *this,CharSetLeaf *param_1)

{
  CharSetLeaf *param_1_local;
  CharSetLeaf *this_local;
  
  CharSetNode::CharSetNode(&this->super_CharSetNode,&param_1->super_CharSetNode);
  (this->super_CharSetNode)._vptr_CharSetNode = (_func_int **)&PTR_FreeSelf_01e4ed00;
  *(undefined8 *)(this->vec).vec = *(undefined8 *)(param_1->vec).vec;
  *(undefined8 *)((this->vec).vec + 2) = *(undefined8 *)((param_1->vec).vec + 2);
  *(undefined8 *)((this->vec).vec + 4) = *(undefined8 *)((param_1->vec).vec + 4);
  *(undefined8 *)((this->vec).vec + 6) = *(undefined8 *)((param_1->vec).vec + 6);
  return;
}

Assistant:

struct CharSetLeaf sealed : CharSetNode
    {
    private:
        template <typename C>
        void ToEquivClass(ArenaAllocator* allocator, uint level, uint base, uint& tblidx, CharSet<C>& result, codepoint_t baseOffset = 0x0) const;
    public:
        CharBitvec vec;

        CharSetLeaf();
        void FreeSelf(ArenaAllocator* allocator) override;
        CharSetNode* Clone(ArenaAllocator* allocator) const override;
        CharSetNode* Set(ArenaAllocator* allocator, uint level, uint l, uint h) override;
        CharSetNode* ClearRange(ArenaAllocator* allocator, uint level, uint l, uint h) override;
        CharSetNode* UnionInPlace(ArenaAllocator* allocator, uint level, const CharSetNode* other) override;
        bool Get(uint level, uint k) const override;
        void ToComplement(ArenaAllocator* allocator, uint level, uint base, CharSet<Char>& result) const override;
        void ToEquivClassW(ArenaAllocator* allocator, uint level, uint base, uint& tblidx, CharSet<char16>& result) const override;
        void ToEquivClassCP(ArenaAllocator* allocator, uint level, uint base, uint& tblidx, CharSet<codepoint_t>& result, codepoint_t baseOffset) const override;
        bool IsSubsetOf(uint level, const CharSetNode* other) const override;
        bool IsEqualTo(uint level, const CharSetNode* other) const override;
        uint Count(uint level) const override;
        _Success_(return) bool GetNextRange(uint level, Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar) const override;
#if DBG
        bool IsLeaf() const override;
#endif
    }